

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O2

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  char *pcVar2;
  UINT8 UVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  CPCONV *pCVar9;
  long lVar10;
  char *outPtr;
  size_t remBytesIn;
  CPCONV *local_48;
  size_t remBytesOut;
  char *inPtr;
  
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  remBytesIn = inSize;
  local_48 = cpc;
  if (inSize == 0) {
    sVar8 = cpc->cpfCharSize;
    if (sVar8 == 1) {
      sVar4 = strlen(inStr);
    }
    else if (sVar8 == 2) {
      sVar5 = 0xfffffffffffffffe;
      do {
        sVar4 = sVar5 + 2;
        lVar10 = sVar5 + 2;
        sVar5 = sVar4;
      } while (*(short *)(inStr + lVar10) != 0);
    }
    else if (sVar8 == 4) {
      sVar5 = 0xfffffffffffffffc;
      do {
        sVar4 = sVar5 + 4;
        lVar10 = sVar5 + 4;
        sVar5 = sVar4;
      } while (*(int *)(inStr + lVar10) != 0);
    }
    else {
      sVar4 = 0;
    }
    remBytesIn = sVar4 + sVar8;
    if (remBytesIn == 0) {
      sVar8 = 0;
      UVar3 = '\0';
      goto LAB_0015c1bc;
    }
  }
  pCVar9 = local_48;
  pcVar2 = *outStr;
  inPtr = inStr;
  if (pcVar2 == (char *)0x0) {
    sVar4 = (remBytesIn * local_48->cptCharSize * 3 >> 1) / local_48->cpfCharSize;
    outPtr = (char *)malloc(sVar4);
    *outStr = outPtr;
  }
  else {
    sVar4 = *outSize;
    outPtr = pcVar2;
  }
  pcVar7 = (char *)0x0;
  remBytesOut = sVar4;
  while (sVar5 = iconv(pCVar9->hIConv,&inPtr,&remBytesIn,&outPtr,&remBytesOut),
        sVar5 == 0xffffffffffffffff) {
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
      UVar3 = 0x80;
      if ((iVar1 == 0x16) && (remBytesIn < 2)) {
        iconv(pCVar9->hIConv,(char **)0x0,(size_t *)0x0,&outPtr,&remBytesOut);
        UVar3 = '\x01';
      }
      goto LAB_0015c1b4;
    }
    if (pcVar2 != (char *)0x0) {
      UVar3 = '\x10';
      goto LAB_0015c1b4;
    }
    if (pcVar7 == outPtr) {
      UVar3 = 0xf0;
      goto LAB_0015c1b4;
    }
    lVar10 = (long)outPtr - (long)*outStr;
    sVar4 = sVar4 + remBytesIn * 2;
    pcVar7 = (char *)realloc(*outStr,sVar4);
    *outStr = pcVar7;
    pcVar7 = pcVar7 + lVar10;
    remBytesOut = sVar4 - lVar10;
    pCVar9 = local_48;
    outPtr = pcVar7;
  }
  UVar3 = '\0';
LAB_0015c1b4:
  sVar8 = (long)outPtr - (long)*outStr;
LAB_0015c1bc:
  *outSize = sVar8;
  return UVar3;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	UINT8 canRealloc;
	char* outPtrPrev;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	if (! inSize)
		inSize = GetStrSize(inStr, cpc->cpfCharSize) + cpc->cpfCharSize;	// include \0 terminator
	remBytesIn = inSize;
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the iconv API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x00;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * cpc->cptCharSize * 3 / 2 / cpc->cpfCharSize;
		*outStr = (char*)malloc(outBufSize);
		canRealloc = 1;
	}
	else
	{
		outBufSize = *outSize;
		canRealloc = 0;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;	// default: conversion successfull
	outPtrPrev = NULL;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		int err = errno;
		if (err == EILSEQ || err == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (err == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;	// conversion incomplete due to input error
			}
			break;
		}
		// err == E2BIG
		if (! canRealloc)
		{
			resVal = 0x10;	// conversion incomplete due to lack of buffer space
			break;
		}
		if (outPtrPrev == outPtr)
		{
			resVal = 0xF0;	// unexpected conversion error
			break;
		}
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		outPtrPrev = outPtr;
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}